

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldGenerator::GenerateBuilderParsingCode
          (ImmutableMessageFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  char *pcVar2;
  size_t sVar3;
  string_view text;
  
  TVar1 = GetType(this->descriptor_);
  if (TVar1 == TYPE_GROUP) {
    pcVar2 = 
    "input.readGroup($number$,\n    internalGet$capitalized_name$FieldBuilder().getBuilder(),\n    extensionRegistry);\n$set_has_field_bit_builder$\n"
    ;
    sVar3 = 0x8c;
  }
  else {
    pcVar2 = 
    "input.readMessage(\n    internalGet$capitalized_name$FieldBuilder().getBuilder(),\n    extensionRegistry);\n$set_has_field_bit_builder$\n"
    ;
    sVar3 = 0x85;
  }
  text._M_str = pcVar2;
  text._M_len = sVar3;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text);
  return;
}

Assistant:

void ImmutableMessageFieldGenerator::GenerateBuilderParsingCode(
    io::Printer* printer) const {
  if (GetType(descriptor_) == FieldDescriptor::TYPE_GROUP) {
    printer->Print(variables_,
                   "input.readGroup($number$,\n"
                   "    "
                   "internalGet$capitalized_name$FieldBuilder().getBuilder(),\n"
                   "    extensionRegistry);\n"
                   "$set_has_field_bit_builder$\n");
  } else {
    printer->Print(variables_,
                   "input.readMessage(\n"
                   "    "
                   "internalGet$capitalized_name$FieldBuilder().getBuilder(),\n"
                   "    extensionRegistry);\n"
                   "$set_has_field_bit_builder$\n");
  }
}